

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShape.cpp
# Opt level: O1

void __thiscall chrono::ChVisualShape::ArchiveIN(ChVisualShape *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChVisualShape>(marchive);
  (**(code **)(*(long *)marchive + 0x10))(marchive);
  return;
}

Assistant:

void ChVisualShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChVisualShape>();
    // stream in all member data:
    marchive >> CHNVP(visible);
}